

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KReach.cpp
# Opt level: O3

void __thiscall KReach::cover(KReach *this,vertex_t v)

{
  pointer puVar1;
  uint *puVar2;
  pointer puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  uint *i;
  uint *puVar5;
  ulong uVar6;
  
  puVar1 = (this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)v <
      (ulong)((long)(this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    puVar1[v] = 0;
    pvVar4 = Graph::successors(this->graph_,v);
    puVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar5 != puVar2) {
      puVar1 = (this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar6 = (ulong)*puVar5;
        if ((ulong)((long)puVar3 - (long)puVar1 >> 2) <= uVar6) goto LAB_00104e8c;
        if (puVar1[uVar6] != 0) {
          puVar1[uVar6] = puVar1[uVar6] - 1;
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
    pvVar4 = Graph::predecessors(this->graph_,v);
    puVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar5 != puVar2) {
      puVar1 = (this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->degree_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar6 = (ulong)*puVar5;
        if ((ulong)((long)puVar3 - (long)puVar1 >> 2) <= uVar6) goto LAB_00104e8c;
        if (puVar1[uVar6] != 0) {
          puVar1[uVar6] = puVar1[uVar6] - 1;
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
    return;
  }
LAB_00104e8c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void KReach::cover(vertex_t v) {
    degree_.at(v) = 0;
    for (const auto &i : graph_.successors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
    for (const auto &i : graph_.predecessors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
}